

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ReportLastSystemError(char *msg)

{
  string m;
  long *local_48 [2];
  long local_38 [2];
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,msg,(allocator<char> *)local_48);
  std::__cxx11::string::append((char *)&local_28);
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::string::_M_append((char *)&local_28,(ulong)local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  Error(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m = msg;
  m += ": System Error: ";
  m += Superclass::GetLastSystemError();
  cmSystemTools::Error(m);
}